

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

uint ZSTD_getLongOffsetsShare(ZSTD_seqSymbol *offTable)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  void *ptr;
  
  if (offTable->baseValue < 9) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      iVar1 = (iVar1 + 1) - (uint)(offTable[lVar3 + 1].nbAdditionalBits < 0x17);
      lVar3 = lVar3 + 1;
      bVar2 = (byte)offTable->baseValue;
    } while ((uint)lVar3 >> (bVar2 & 0x1f) == 0);
    return iVar1 << (8 - bVar2 & 0x1f);
  }
  __assert_fail("max <= (1 << OffFSELog)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x6597,"unsigned int ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol *)");
}

Assistant:

static unsigned
ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol* offTable)
{
    const void* ptr = offTable;
    U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
    const ZSTD_seqSymbol* table = offTable + 1;
    U32 const max = 1 << tableLog;
    U32 u, total = 0;
    DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

    assert(max <= (1 << OffFSELog));  /* max not too large */
    for (u=0; u<max; u++) {
        if (table[u].nbAdditionalBits > 22) total += 1;
    }

    assert(tableLog <= OffFSELog);
    total <<= (OffFSELog - tableLog);  /* scale to OffFSELog */

    return total;
}